

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

void process_statement_list(CompilerState *compiler_state,AstNodeList *list)

{
  undefined1 local_38 [8];
  PtrListIterator nodeiter__;
  AstNode *node;
  AstNodeList *list_local;
  CompilerState *compiler_state_local;
  
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_38,(PtrList *)list);
  nodeiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
  while (nodeiter__._16_8_ != 0) {
    process_statement(compiler_state,(AstNode *)nodeiter__._16_8_);
    nodeiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
  }
  return;
}

Assistant:

static void process_statement_list(CompilerState *compiler_state, AstNodeList *list)
{
	AstNode *node;
	FOR_EACH_PTR(list, AstNode, node) { process_statement(compiler_state, node); }
	END_FOR_EACH_PTR(node);
}